

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstr.c
# Opt level: O3

uint8_t * bstr_match_pair(uint8_t *pBegin,uint8_t *pEnd,uint8_t left,uint8_t right,
                         uint8_t escapeChar)

{
  uint8_t uVar1;
  bool bVar2;
  uint8_t *pNext;
  uint8_t *puVar3;
  int iVar4;
  uint uVar5;
  
  if (pBegin < pEnd) {
    if (*pBegin != left) {
      return (uint8_t *)0x0;
    }
    puVar3 = pBegin + 1;
    if (escapeChar == '\0') {
      if (puVar3 < pEnd) {
        iVar4 = 0;
        do {
          if (*puVar3 == right) {
            uVar5 = 0xffffffff;
            if (iVar4 == 0) {
              return puVar3;
            }
          }
          else {
            uVar5 = (uint)(*puVar3 == left);
          }
          iVar4 = iVar4 + uVar5;
          puVar3 = puVar3 + 1;
        } while (puVar3 != pEnd);
      }
    }
    else if (puVar3 < pEnd) {
      bVar2 = false;
      iVar4 = 0;
      do {
        if (bVar2) {
LAB_001396a5:
          bVar2 = false;
        }
        else {
          uVar1 = *puVar3;
          bVar2 = true;
          if (uVar1 != escapeChar) {
            if (uVar1 == right) {
              if (iVar4 == 0) {
                return puVar3;
              }
              iVar4 = iVar4 + -1;
            }
            else {
              iVar4 = iVar4 + (uint)(uVar1 == left);
            }
            goto LAB_001396a5;
          }
        }
        puVar3 = puVar3 + 1;
      } while (puVar3 < pEnd);
    }
  }
  return pBegin;
}

Assistant:

const uint8_t *bstr_match_pair(const uint8_t *pBegin, const uint8_t *pEnd, uint8_t left, uint8_t right, uint8_t escapeChar){
   const uint8_t *pNext = pBegin;
   uint32_t innerLevelCount=0;
   if (pNext < pEnd){
      if (*pNext == left){
         pNext++;
         if (escapeChar != 0){
            uint8_t isEscape = 0;
            while (pNext < pEnd){
               uint8_t c = *pNext;
               if (isEscape != 0){
                  //ignore this char
                  pNext++;
                  isEscape = 0;
                  continue;
               }
               else {
                  if ( c == escapeChar ){
                     isEscape = 1;
                  }
                  else if (c == right){
                     if (innerLevelCount == 0) {
                        return pNext;
                     }
                     else {
                        innerLevelCount--;
                     }
                  }
                  else if ( c == left )
                  {
                     innerLevelCount++;
                  }
               }
               pNext++;
            }
         }
         else{
            while (pNext < pEnd) {
               uint8_t c = *pNext;
               if (c == right){
                  if (innerLevelCount == 0) {
                     return pNext;
                  }
                  else {
                     innerLevelCount--;
                  }
               }
               else if (c == left)
               {
                  innerLevelCount++;
               }
               pNext++;
            }
         }
      }
      else
      {
         return 0; //string does not start with \par left character
      }
   }
   return pBegin;
}